

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::InputFile::Data::copyCachedBuffer
          (Data *this,ConstIterator to,ConstIterator from,int scanline1,int scanline2,int yStart,
          int xStart,int width)

{
  Slice *pSVar1;
  undefined8 uVar2;
  ArgExc *this_00;
  long lVar3;
  int in_ECX;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int x_1;
  int x;
  char *fromPtr;
  char *toPtr;
  int y;
  Slice fromSlice;
  Slice toSlice;
  char *in_stack_ffffffffffffff08;
  ArgExc *in_stack_ffffffffffffff10;
  int local_c8;
  int local_c4;
  undefined4 *local_c0;
  undefined4 *local_b8;
  int local_ac;
  int local_a8 [2];
  long local_a0;
  long local_98;
  long local_90;
  int local_88;
  int local_84;
  byte local_78;
  byte local_77;
  int local_60 [2];
  long local_58;
  long local_50;
  long local_48;
  int local_40;
  int local_3c;
  byte local_30;
  byte local_2f;
  int local_24;
  int local_20;
  int local_1c;
  
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_1c = in_ECX;
  pSVar1 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x90ac01);
  memcpy(local_60,pSVar1,0x38);
  if ((local_40 != 1) || (local_3c != 1)) {
    uVar2 = __cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    __cxa_throw(uVar2,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  pSVar1 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x90ac95);
  memcpy(local_a8,pSVar1,0x38);
  if ((local_88 != 1) || (local_84 != 1)) {
    uVar2 = __cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    __cxa_throw(uVar2,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  if (((local_78 & 1) != 0) || ((local_77 & 1) == 0)) {
    uVar2 = __cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    __cxa_throw(uVar2,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  if (local_60[0] != local_a8[0]) {
    uVar2 = __cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    __cxa_throw(uVar2,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  if ((local_98 != 2) && (local_98 != 4)) {
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc(this_00,in_stack_ffffffffffffff08);
    __cxa_throw(this_00,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  for (local_ac = local_1c; local_ac <= local_20; local_ac = local_ac + 1) {
    if ((local_2f & 1) == 0) {
      lVar3 = (long)local_ac;
    }
    else {
      lVar3 = (long)local_ac - (long)local_24;
    }
    local_b8 = (undefined4 *)(lVar3 * local_48 + local_58);
    if ((local_30 & 1) == 0) {
      local_b8 = (undefined4 *)(in_stack_00000008 * local_50 + (long)local_b8);
    }
    lVar3 = ((long)local_ac - (long)local_24) * local_90 + local_a0;
    if (local_98 == 2) {
      local_c0 = (undefined4 *)((long)in_stack_00000008 * 2 + lVar3);
      for (local_c4 = 0; local_c4 < in_stack_00000010; local_c4 = local_c4 + 1) {
        *(undefined2 *)local_b8 = *(undefined2 *)local_c0;
        local_b8 = (undefined4 *)(local_50 + (long)local_b8);
        local_c0 = (undefined4 *)((long)local_c0 + 2);
      }
    }
    else {
      local_c0 = (undefined4 *)((long)in_stack_00000008 * 4 + lVar3);
      for (local_c8 = 0; local_c8 < in_stack_00000010; local_c8 = local_c8 + 1) {
        *local_b8 = *local_c0;
        local_b8 = (undefined4 *)(local_50 + (long)local_b8);
        local_c0 = local_c0 + 1;
      }
    }
  }
  return;
}

Assistant:

void
InputFile::Data::copyCachedBuffer (FrameBuffer::ConstIterator to,
                                   FrameBuffer::ConstIterator from,
                                   int scanline1, int scanline2,
                                   int yStart, int xStart, int width)
{
    Slice toSlice = to.slice ();
    if (toSlice.xSampling != 1 || toSlice.ySampling != 1)
        throw IEX_NAMESPACE::ArgExc ("Tiled data should not have subsampling.");
    Slice fromSlice = from.slice ();
    if (fromSlice.xSampling != 1 || fromSlice.ySampling != 1)
        throw IEX_NAMESPACE::ArgExc ("Tiled data should not have subsampling.");
    if (fromSlice.xTileCoords || !fromSlice.yTileCoords)
        throw IEX_NAMESPACE::ArgExc ("Invalid expectation around tile coords flags from setFrameBuffer.");

    if (toSlice.type != fromSlice.type)
        throw IEX_NAMESPACE::ArgExc ("Invalid type mismatch in slice from setFrameBuffer.");
    if (fromSlice.xStride != 2 && fromSlice.xStride != 4)
        throw IEX_NAMESPACE::ArgExc ("Unhandled type in copying tile cache slice.");

    for (int y = scanline1; y <= scanline2; ++y)
    {
        char* toPtr = toSlice.base;
        const char* fromPtr = fromSlice.base;

        if (toSlice.yTileCoords)
            toPtr += ( int64_t (y) - int64_t (yStart) ) * toSlice.yStride;
        else
            toPtr += int64_t (y) * toSlice.yStride;
        if (!toSlice.xTileCoords)
            toPtr += int64_t (xStart) * toSlice.xStride;

        fromPtr += ( int64_t (y) - int64_t (yStart) ) * fromSlice.yStride;
        if (fromSlice.xStride == 2)
        {
            fromPtr += int64_t (xStart) * 2;
            for (int x = 0; x < width; ++x)
            {
                *reinterpret_cast<uint16_t*> (toPtr) =
                    *reinterpret_cast<const uint16_t*> (fromPtr);
                toPtr += toSlice.xStride;
                fromPtr += 2;
            }
        }
        else
        {
            fromPtr += int64_t (xStart) * 4;
            for (int x = 0; x < width; ++x)
            {
                *reinterpret_cast<uint32_t*> (toPtr) =
                    *reinterpret_cast<const uint32_t*> (fromPtr);
                toPtr += toSlice.xStride;
                fromPtr += 4;
            }
        }
    }
}